

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O0

int32_t __thiscall
llama_vocab::impl::detokenize
          (impl *this,llama_token *tokens,int32_t n_tokens,char *text,int32_t text_len_max,
          bool remove_special,bool unparse_special)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  int32_t iVar6;
  long in_RCX;
  long lVar7;
  int in_EDX;
  int *in_RSI;
  long in_RDI;
  int in_R8D;
  byte in_R9B;
  char x2;
  char x1;
  char x_2;
  int32_t i_3;
  int32_t total3;
  char x_1;
  int32_t i_2;
  int32_t total2;
  char x;
  int32_t i_1;
  int32_t total1;
  int32_t n_chars;
  int32_t i;
  bool remove_space;
  int32_t total;
  int32_t avail;
  llama_token in_stack_00000094;
  impl *in_stack_00000098;
  uint local_8c;
  int local_64;
  int local_58;
  int local_4c;
  int local_40;
  uint local_38;
  int local_34;
  long local_28;
  int local_1c;
  int *local_18;
  uint local_4;
  
  if (*(int *)(in_RDI + 4) == 0) {
    local_4 = 0;
  }
  else {
    bVar5 = ::std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<llm_tokenizer,_std::default_delete<llm_tokenizer>_> *)0x53b596);
    if (!bVar5) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-vocab.cpp"
                 ,0xa4f,"GGML_ASSERT(%s) failed",
                 "tokenizer && \"Tokenizer not initialized. Call llama_vocab::init_tokenizer() first.\""
                );
    }
    local_38 = 0;
    local_1c = in_EDX;
    local_18 = in_RSI;
    if (((((in_R9B & 1) != 0) && ((*(byte *)(in_RDI + 0x4d) & 1) != 0)) && (0 < in_EDX)) &&
       (*in_RSI == *(int *)(in_RDI + 0x10))) {
      local_1c = in_EDX + -1;
      local_18 = in_RSI + 1;
    }
    if ((((in_R9B & 1) != 0) && ((*(byte *)(in_RDI + 0x4e) & 1) != 0)) &&
       ((0 < local_1c && (local_18[local_1c + -1] == *(int *)(in_RDI + 0x14))))) {
      local_1c = local_1c + -1;
    }
    local_40 = 0;
    local_34 = in_R8D;
    local_28 = in_RCX;
    while( true ) {
      uVar3 = local_38;
      if (local_1c <= local_40) break;
      if (local_34 < 0) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-vocab.cpp"
                   ,0xa66,"GGML_ASSERT(%s) failed","avail >= 0");
      }
      iVar6 = token_to_piece(in_stack_00000098,in_stack_00000094,(char *)this,tokens._4_4_,
                             (int32_t)tokens,n_tokens._3_1_);
      if (iVar6 < 0) {
        local_34 = 0;
        local_38 = local_38 - iVar6;
      }
      else if (0 < iVar6) {
        local_34 = local_34 - iVar6;
        local_28 = local_28 + iVar6;
        local_38 = iVar6 + local_38;
      }
      local_40 = local_40 + 1;
    }
    if (in_R8D < (int)local_38) {
      local_4 = -local_38;
    }
    else {
      if ((*(byte *)(in_RDI + 0x50) & 1) != 0) {
        local_28 = local_28 - (int)local_38;
        local_38 = (uint)(local_38 != 0);
        for (local_4c = 1; uVar4 = local_38, local_4c < (int)uVar3; local_4c = local_4c + 1) {
          cVar1 = *(char *)(local_28 + local_4c);
          if ((*(char *)(local_28 + (local_4c + -1)) == ' ') &&
             (((cVar1 == '?' || (cVar1 == '!')) || ((cVar1 == '.' || (cVar1 == ',')))))) {
            local_38 = local_38 - 1;
          }
          *(char *)(local_28 + (int)local_38) = cVar1;
          local_38 = local_38 + 1;
        }
        local_38 = (uint)(local_38 != 0);
        for (local_58 = 1; uVar3 = local_38, local_58 < (int)uVar4; local_58 = local_58 + 1) {
          lVar7 = (long)local_58;
          if ((((*(char *)(local_28 + lVar7) == '\'') && (local_58 + 1 < (int)uVar4)) &&
              (*(char *)(local_28 + (local_58 + -1)) == ' ')) &&
             (*(char *)(local_28 + (local_58 + 1)) == ' ')) {
            local_38 = local_38 - 1;
            local_58 = local_58 + 1;
            *(undefined1 *)(local_28 + local_58) = 0;
          }
          *(char *)(local_28 + (int)local_38) = *(char *)(local_28 + lVar7);
          local_38 = local_38 + 1;
        }
        local_38 = (uint)(local_38 != 0);
        for (local_64 = 1; local_64 < (int)uVar3; local_64 = local_64 + 1) {
          if (((*(char *)(local_28 + (local_64 + -1)) == ' ') &&
              (*(char *)(local_28 + local_64) == '\'')) &&
             ((local_64 + 1 < (int)uVar3 &&
              ((cVar1 = *(char *)(local_28 + (local_64 + 1)), cVar1 != 't' && (cVar1 != 'd')))))) {
            if ((cVar1 == 's') || (cVar1 == 'm')) {
              local_38 = local_38 - 1;
            }
            else if (((local_64 + 2 < (int)uVar3) &&
                     ((cVar2 = *(char *)(local_28 + (local_64 + 2)), cVar1 != 'l' || (cVar2 != 'l'))
                     )) && (((cVar1 == 'r' && (cVar2 == 'e')) || ((cVar1 == 'v' && (cVar2 == 'e'))))
                           )) {
              local_38 = local_38 - 1;
            }
          }
          *(char *)(local_28 + (int)local_38) = *(char *)(local_28 + local_64);
          local_38 = local_38 + 1;
        }
      }
      if (in_R8D < (int)local_38) {
        local_8c = -local_38;
      }
      else {
        local_8c = local_38;
      }
      local_4 = local_8c;
    }
  }
  return local_4;
}

Assistant:

int32_t llama_vocab::impl::detokenize(
               const llama_token * tokens,
                         int32_t   n_tokens,
                            char * text,
                         int32_t   text_len_max,
                            bool   remove_special,
                            bool   unparse_special) const {
    if (type == LLAMA_VOCAB_TYPE_NONE) {
        return 0;
    }

    GGML_ASSERT(tokenizer && "Tokenizer not initialized. Call llama_vocab::init_tokenizer() first.");

    int32_t avail = text_len_max;
    int32_t total = 0;

    // remove the leading space
    bool remove_space = add_space_prefix;

    if (remove_special && add_bos) {
        if (n_tokens > 0 && tokens[0] == special_bos_id) {
            remove_space = false;
            n_tokens--;
            tokens++;
        }
    }

    if (remove_special && add_eos) {
        if (n_tokens > 0 && tokens[n_tokens - 1] == special_eos_id) {
            n_tokens--;
        }
    }

    for (int32_t i = 0; i < n_tokens; ++i) {
        GGML_ASSERT(avail >= 0);
        int32_t n_chars = token_to_piece(tokens[i], text, avail, remove_space, unparse_special);
        remove_space = false;
        if (n_chars < 0) {
            avail = 0;
            total -= n_chars;
        } else if (n_chars > 0) {
            avail -= n_chars;
            text  += n_chars;
            total += n_chars;
        }
    }

    if (total > text_len_max) {
        return -total;
    }

    if (clean_spaces) {
        text -= total;  // restart text

        // first pass: characters ?!.,  //TODO: where do these characters come from?
        const int32_t total1 = total;
        total = total ? 1 : 0;
        for (int32_t i = 1; i < total1; ++i) {
            const char x = text[i];
            if (text[i - 1] == ' ') {
                if (x == '?' || x == '!' || x == '.' || x == ',') {  // " ?", " !", " .", " ,"
                    total--;  // remove space
                }
            }
            text[total++] = x;
        }

        // second pass: strip single apostrophe between spaces
        const int32_t total2 = total;
        total = total ? 1 : 0;
        for (int32_t i = 1; i < total2; ++i) {
            const char x = text[i];
            if (x == '\'' && i + 1 < total2 && text[i - 1] == ' ' && text[i + 1] == ' ') {  // " ' "
                total--;           // remove prev space
                text[++i] = '\0';  // remove next space
            }
            text[total++] = x;
        }

        // third pass: apostrophe contractions  //NOTE: this makes sense?
        const int32_t total3 = total;
        total = total ? 1 : 0;
        for (int32_t i = 1; i < total3; ++i) {
            const char x = text[i];
            if (text[i - 1] == ' ') {
                if (x == '\'' && i + 1 < total3) {
                    const char x1 = text[i + 1];
                    if (x1 == 't' || x1 == 'd') {  // " 't", " 'd"
                        //total--;  // remove space
                    } else if (x1 == 's' || x1 == 'm') {  // " 's", " 'm"
                        total--;  // remove space
                    } else if (i + 2 < total3) {
                        const char x2 = text[i + 2];
                        if ((x1 == 'l' && x2 == 'l')) {  // " 'll"
                            //total--;  // remove space
                        } else if ((x1 == 'r' && x2 == 'e') || (x1 == 'v' && x2 == 'e')) {  // " 're", " 've"
                            total--;  // remove space
                        } else {
                            //total--;  // remove space
                        }
                    } else {
                        //total--;  // remove space
                    }
                }
            }
            text[total++] = x;
        }
    }

    return total <= text_len_max ? total : -total;
}